

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_join_leave.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::rm_srv_from_cluster(raft_server *this,int32 srv_id)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  element_type *peVar5;
  undefined4 extraout_var;
  element_type *peVar6;
  element_type *this_01;
  element_type *this_02;
  ulong uVar7;
  element_type *peVar8;
  uint in_ESI;
  long in_RDI;
  ptr<peer> pp;
  iterator p_entry;
  ptr<log_entry> entry;
  ptr<buffer> new_conf_buf;
  const_iterator it;
  ptr<cluster_config> new_conf;
  ptr<cluster_config> cur_conf;
  cluster_config *in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  value_type *in_stack_fffffffffffffdd8;
  list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  *in_stack_fffffffffffffde0;
  raft_server *in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffe10;
  uint in_stack_fffffffffffffe14;
  ptr<log_entry> *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe24;
  string local_158 [48];
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_128;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_120;
  uint64_t local_118;
  undefined1 local_109;
  ulong local_108;
  string local_e0 [32];
  string local_c0 [32];
  _Self local_a0;
  _Self local_98;
  ulong local_90;
  cluster_config *local_88;
  string local_70 [64];
  string local_30 [36];
  uint local_c;
  cluster_config *this_00;
  
  local_c = in_ESI;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x3b8));
  if (bVar1) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar1) {
      peVar8 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x21809c);
      iVar2 = (*peVar8->_vptr_logger[7])();
      if (2 < iVar2) {
        peVar8 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2180c2);
        std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x2180de);
        uVar3 = peer::get_id((peer *)0x2180e6);
        msg_if_given_abi_cxx11_
                  ((char *)local_30,
                   "to-be-removed server %d already exists, cannot remove server %d for now",
                   (ulong)uVar3,(ulong)local_c);
        (*peVar8->_vptr_logger[8])
                  (peVar8,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                   ,"rm_srv_from_cluster",0x1e3,local_30);
        std::__cxx11::string::~string(local_30);
      }
    }
  }
  else {
    get_config(in_stack_fffffffffffffde8);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x390));
    if (bVar1) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar1) {
        peVar8 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2181de);
        iVar2 = (*peVar8->_vptr_logger[7])();
        if (3 < iVar2) {
          peVar8 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x218217);
          peVar6 = std::
                   __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x218233);
          uVar7 = cluster_config::get_log_idx(peVar6);
          peVar6 = std::
                   __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x218259);
          uVar4 = cluster_config::get_prev_log_idx(peVar6);
          msg_if_given_abi_cxx11_
                    ((char *)local_70,"uncommitted config exists at log %lu, prev log %lu",uVar7,
                     uVar4);
          (*peVar8->_vptr_logger[8])
                    (peVar8,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                     ,"rm_srv_from_cluster",0x1ee,local_70);
          std::__cxx11::string::~string(local_70);
        }
      }
      std::shared_ptr<nuraft::cluster_config>::operator=
                ((shared_ptr<nuraft::cluster_config> *)
                 CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                 (shared_ptr<nuraft::cluster_config> *)in_stack_fffffffffffffdc8);
    }
    peVar5 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x218345);
    iVar2 = (*peVar5->_vptr_log_store[2])();
    this_00 = (cluster_config *)CONCAT44(extraout_var,iVar2);
    local_88 = this_00;
    peVar6 = std::
             __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x218378);
    local_90 = cluster_config::get_log_idx(peVar6);
    cs_new<nuraft::cluster_config,unsigned_long,unsigned_long>
              ((unsigned_long *)in_stack_fffffffffffffdd8,
               (unsigned_long *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    peVar6 = std::
             __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2183c6);
    cluster_config::get_servers_abi_cxx11_(peVar6);
    local_98._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
         ::cbegin((list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                   *)in_stack_fffffffffffffdc8);
    while( true ) {
      peVar6 = std::
               __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2183fa);
      cluster_config::get_servers_abi_cxx11_(peVar6);
      local_a0._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
           ::cend((list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                   *)in_stack_fffffffffffffdc8);
      bVar1 = std::operator!=(&local_98,&local_a0);
      if (!bVar1) break;
      std::_List_const_iterator<std::shared_ptr<nuraft::srv_config>_>::operator*
                ((_List_const_iterator<std::shared_ptr<nuraft::srv_config>_> *)
                 CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
      this_01 = std::
                __shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x218454);
      uVar3 = srv_config::get_id(this_01);
      if (uVar3 != local_c) {
        peVar6 = std::
                 __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x218482);
        cluster_config::get_servers_abi_cxx11_(peVar6);
        std::_List_const_iterator<std::shared_ptr<nuraft::srv_config>_>::operator*
                  ((_List_const_iterator<std::shared_ptr<nuraft::srv_config>_> *)
                   CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
        std::__cxx11::
        list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
        ::push_back(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      }
      std::_List_const_iterator<std::shared_ptr<nuraft::srv_config>_>::operator++(&local_98);
    }
    std::__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x2184e9);
    std::__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x2184fb);
    cluster_config::get_user_ctx_abi_cxx11_(in_stack_fffffffffffffdc8);
    cluster_config::set_user_ctx
              ((cluster_config *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
               (string *)in_stack_fffffffffffffdc8);
    std::__cxx11::string::~string(local_c0);
    peVar6 = std::
             __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x21853b);
    this_02 = std::
              __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x21854d);
    bVar1 = cluster_config::is_async_replication(this_02);
    cluster_config::set_async_replication(peVar6,bVar1);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar1) {
      peVar8 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2185a2);
      in_stack_fffffffffffffe24 = (*peVar8->_vptr_logger[7])();
      if (3 < in_stack_fffffffffffffe24) {
        peVar8 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2185d5);
        in_stack_fffffffffffffe14 = local_c;
        peVar6 = std::
                 __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2185f2);
        in_stack_fffffffffffffe18 = (ptr<log_entry> *)cluster_config::get_log_idx(peVar6);
        msg_if_given_abi_cxx11_
                  ((char *)local_e0,
                   "removed server %d from configuration and save the configuration to log store at %lu"
                   ,(ulong)in_stack_fffffffffffffe14,in_stack_fffffffffffffe18);
        (*peVar8->_vptr_logger[8])
                  (peVar8,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                   ,"rm_srv_from_cluster",0x203,local_e0);
        std::__cxx11::string::~string(local_e0);
      }
    }
    *(undefined1 *)(in_RDI + 0xe9) = 1;
    std::shared_ptr<nuraft::cluster_config>::operator=
              ((shared_ptr<nuraft::cluster_config> *)
               CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
               (shared_ptr<nuraft::cluster_config> *)in_stack_fffffffffffffdc8);
    std::__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x2186e0);
    cluster_config::serialize(this_00);
    std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x218706);
    local_108 = srv_state::get_term((srv_state *)0x21870e);
    local_109 = 2;
    local_118 = timer_helper::get_timeofday_us();
    cs_new<nuraft::log_entry,unsigned_long,std::shared_ptr<nuraft::buffer>&,nuraft::log_val_type,unsigned_long>
              ((unsigned_long *)in_stack_fffffffffffffde8,
               (shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffde0,
               (log_val_type *)in_stack_fffffffffffffdd8,
               (unsigned_long *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    store_log_entry((raft_server *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                    in_stack_fffffffffffffe18,
                    CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    local_120._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
         ::find((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                 *)in_stack_fffffffffffffdc8,(key_type *)0x2187a9);
    local_128._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
         ::end((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                *)in_stack_fffffffffffffdc8);
    bVar1 = std::__detail::operator!=(&local_120,&local_128);
    if (bVar1) {
      std::__detail::
      _Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::operator->
                ((_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                  *)0x218804);
      std::shared_ptr<nuraft::peer>::shared_ptr
                ((shared_ptr<nuraft::peer> *)
                 CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                 (shared_ptr<nuraft::peer> *)in_stack_fffffffffffffdc8);
      std::shared_ptr<nuraft::peer>::operator=
                ((shared_ptr<nuraft::peer> *)
                 CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                 (shared_ptr<nuraft::peer> *)in_stack_fffffffffffffdc8);
      peVar6 = std::
               __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x218843);
      uVar7 = cluster_config::get_log_idx(peVar6);
      *(ulong *)(in_RDI + 0x3c8) = uVar7;
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar1) {
        peVar8 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x21888f);
        iVar2 = (*peVar8->_vptr_logger[7])();
        if (3 < iVar2) {
          peVar8 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2188c2);
          msg_if_given_abi_cxx11_
                    ((char *)local_158,
                     "set srv_to_leave_, server %d will be removed from cluster, config %lu",
                     (ulong)local_c,*(undefined8 *)(in_RDI + 0x3c8));
          (*peVar8->_vptr_logger[8])
                    (peVar8,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                     ,"rm_srv_from_cluster",0x215,local_158);
          std::__cxx11::string::~string(local_158);
        }
      }
      std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x2189ae);
    }
    request_append_entries
              ((raft_server *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    std::shared_ptr<nuraft::log_entry>::~shared_ptr((shared_ptr<nuraft::log_entry> *)0x2189db);
    std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x2189e8);
    std::shared_ptr<nuraft::cluster_config>::~shared_ptr
              ((shared_ptr<nuraft::cluster_config> *)0x2189f5);
    std::shared_ptr<nuraft::cluster_config>::~shared_ptr
              ((shared_ptr<nuraft::cluster_config> *)0x218a02);
  }
  return;
}

Assistant:

void raft_server::rm_srv_from_cluster(int32 srv_id) {
    if (srv_to_leave_) {
        p_wn("to-be-removed server %d already exists, "
             "cannot remove server %d for now",
             srv_to_leave_->get_id(), srv_id);
        return;
    }

    ptr<cluster_config> cur_conf = get_config();

    // NOTE: Need to honor uncommitted config,
    //       refer to comment in `sync_log_to_new_srv()`
    if (uncommitted_config_) {
        p_in("uncommitted config exists at log %" PRIu64 ", prev log %" PRIu64,
             uncommitted_config_->get_log_idx(),
             uncommitted_config_->get_prev_log_idx());
        cur_conf = uncommitted_config_;
    }

    ptr<cluster_config> new_conf = cs_new<cluster_config>
                                   ( log_store_->next_slot(),
                                     cur_conf->get_log_idx() );
    for (auto it = cur_conf->get_servers().cbegin();
          it != cur_conf->get_servers().cend();
          ++it ) {
        if ((*it)->get_id() != srv_id) {
            new_conf->get_servers().push_back(*it);
        }
    }
    new_conf->set_user_ctx( cur_conf->get_user_ctx() );
    new_conf->set_async_replication
              ( cur_conf->is_async_replication() );

    p_in( "removed server %d from configuration and "
          "save the configuration to log store at %" PRIu64,
          srv_id,
          new_conf->get_log_idx() );

    config_changing_ = true;
    uncommitted_config_ = new_conf;
    ptr<buffer> new_conf_buf( new_conf->serialize() );
    ptr<log_entry> entry( cs_new<log_entry>( state_->get_term(),
                                             new_conf_buf,
                                             log_val_type::conf,
                                             timer_helper::get_timeofday_us() ) );
    store_log_entry(entry);

    auto p_entry = peers_.find(srv_id);
    if (p_entry != peers_.end()) {
        ptr<peer> pp = p_entry->second;
        srv_to_leave_ = pp;
        srv_to_leave_target_idx_ = new_conf->get_log_idx();
        p_in("set srv_to_leave_, "
             "server %d will be removed from cluster, config %" PRIu64,
             srv_id, srv_to_leave_target_idx_);
    }

    request_append_entries();
}